

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O2

void __thiscall
LowererMDArch::EmitLongToInt(LowererMDArch *this,Opnd *dst,Opnd *src,Instr *instrInsert)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Instr *instr;
  
  bVar2 = IR::Opnd::IsRegOpnd(dst);
  if ((!bVar2) || (dst->m_type != TyInt32)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0xa4e,"(dst->IsRegOpnd() && dst->IsInt32())",
                       "dst->IsRegOpnd() && dst->IsInt32()");
    if (!bVar2) goto LAB_005d00f0;
    *puVar3 = 0;
  }
  bVar2 = IR::Opnd::IsInt64(src);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0xa4f,"(src->IsInt64())","src->IsInt64()");
    if (!bVar2) {
LAB_005d00f0:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  instr = IR::Instr::New(MOV_TRUNC,dst,src,instrInsert->m_func);
  IR::Instr::InsertBefore(instrInsert,instr);
  return;
}

Assistant:

void
LowererMDArch::EmitLongToInt(IR::Opnd *dst, IR::Opnd *src, IR::Instr *instrInsert)
{
    Assert(dst->IsRegOpnd() && dst->IsInt32());
    Assert(src->IsInt64());

    instrInsert->InsertBefore(IR::Instr::New(Js::OpCode::MOV_TRUNC, dst, src, instrInsert->m_func));
}